

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O1

void __thiscall
dynet::GRUBuilder::GRUBuilder
          (GRUBuilder *this,uint layers,uint input_dim,uint hidden_dim,ParameterCollection *model)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  long lVar3;
  Parameter PVar4;
  Parameter PVar5;
  Parameter PVar6;
  Parameter PVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ParameterCollection *this_00;
  initializer_list<dynet::Parameter> __l;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  ParameterInit local_150;
  undefined4 local_148;
  string local_140;
  ulong local_120;
  ParameterCollection *local_118;
  _func_int **local_110;
  uint local_104;
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  *local_100;
  undefined1 local_f8 [88];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a0;
  ParameterCollectionStorage *local_68;
  ParameterCollection *pPStack_60;
  ParameterStorage *local_58;
  ParameterStorage *local_50;
  ParameterStorage *local_48;
  ParameterStorage *local_40;
  ParameterStorage *local_38;
  
  (this->super_RNNBuilder).cur = -1;
  (this->super_RNNBuilder).sm.q_ = CREATED;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__GRUBuilder_005bb2b0;
  local_100 = &this->params;
  local_118 = &this->local_model;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParameterCollection::ParameterCollection(local_118);
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->hidden_dim = hidden_dim;
  this->layers = layers;
  paVar1 = &local_140.field_2;
  local_140._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"gru-builder","");
  this_00 = local_118;
  ParameterCollection::add_subcollection((ParameterCollection *)local_f8,model,&local_140);
  std::__cxx11::string::_M_assign((string *)this_00);
  if ((ParameterCollection *)local_f8 != this_00) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->local_model).name_cntr,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(local_f8 + 0x20));
    if ((ParameterCollection *)local_f8 != this_00) {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&(this->local_model).collec_name_cntr,&local_a0);
    }
  }
  (this->local_model).storage = local_68;
  (this->local_model).parent = pPStack_60;
  ParameterCollection::~ParameterCollection((ParameterCollection *)local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if (layers != 0) {
    uVar9 = 0;
    local_110 = (_func_int **)&PTR__ParameterInit_005bfae0;
    local_104 = layers;
    do {
      local_120 = CONCAT44(local_120._4_4_,input_dim);
      local_150._vptr_ParameterInit._4_4_ = input_dim;
      local_150._vptr_ParameterInit._0_4_ = hidden_dim;
      local_f8._28_4_ = 0;
      local_f8._32_4_ = 1;
      lVar3 = 0;
      do {
        uVar8 = (ulong)(uint)local_f8._28_4_;
        local_f8._28_4_ = local_f8._28_4_ + 1;
        *(undefined4 *)(local_f8 + uVar8 * 4) =
             *(undefined4 *)((long)&local_150._vptr_ParameterInit + lVar3);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
      local_140._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
      local_38 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)local_f8,0.0,&local_140,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      local_150._vptr_ParameterInit._4_4_ = hidden_dim;
      local_f8._28_4_ = 0;
      local_f8._32_4_ = 1;
      lVar3 = 0;
      do {
        uVar8 = (ulong)(uint)local_f8._28_4_;
        local_f8._28_4_ = local_f8._28_4_ + 1;
        *(undefined4 *)(local_f8 + uVar8 * 4) =
             *(undefined4 *)((long)&local_150._vptr_ParameterInit + lVar3);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
      local_140._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
      local_40 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)local_f8,0.0,&local_140,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      local_f8._28_4_ = 1;
      local_f8._32_4_ = 1;
      local_f8._0_4_ = hidden_dim;
      local_150._vptr_ParameterInit = local_110;
      local_148 = 0;
      local_140._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
      local_48 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)local_f8,&local_150,&local_140,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      local_150._vptr_ParameterInit._4_4_ = (undefined4)local_120;
      local_f8._28_4_ = 0;
      local_f8._32_4_ = 1;
      lVar3 = 0;
      do {
        uVar8 = (ulong)(uint)local_f8._28_4_;
        local_f8._28_4_ = local_f8._28_4_ + 1;
        *(undefined4 *)(local_f8 + uVar8 * 4) =
             *(undefined4 *)((long)&local_150._vptr_ParameterInit + lVar3);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
      local_140._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
      local_50 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)local_f8,0.0,&local_140,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      local_150._vptr_ParameterInit._4_4_ = hidden_dim;
      local_f8._28_4_ = 0;
      local_f8._32_4_ = 1;
      lVar3 = 0;
      do {
        uVar8 = (ulong)(uint)local_f8._28_4_;
        local_f8._28_4_ = local_f8._28_4_ + 1;
        *(undefined4 *)(local_f8 + uVar8 * 4) =
             *(undefined4 *)((long)&local_150._vptr_ParameterInit + lVar3);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
      local_140._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
      local_58 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)local_f8,0.0,&local_140,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      local_f8._28_4_ = 1;
      local_f8._32_4_ = 1;
      local_150._vptr_ParameterInit = local_110;
      local_148 = 0;
      local_140._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
      PVar4 = ParameterCollection::add_parameters
                        (this_00,(Dim *)local_f8,&local_150,&local_140,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      local_150._vptr_ParameterInit._4_4_ = (undefined4)local_120;
      local_f8._28_4_ = 0;
      local_f8._32_4_ = 1;
      lVar3 = 0;
      do {
        uVar8 = (ulong)(uint)local_f8._28_4_;
        local_f8._28_4_ = local_f8._28_4_ + 1;
        *(undefined4 *)(local_f8 + uVar8 * 4) =
             *(undefined4 *)((long)&local_150._vptr_ParameterInit + lVar3);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
      local_140._M_dataplus._M_p = (pointer)paVar1;
      local_120 = uVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
      PVar5 = ParameterCollection::add_parameters
                        (this_00,(Dim *)local_f8,0.0,&local_140,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      local_150._vptr_ParameterInit._4_4_ = hidden_dim;
      local_f8._28_4_ = 0;
      local_f8._32_4_ = 1;
      lVar3 = 0;
      do {
        uVar9 = (ulong)(uint)local_f8._28_4_;
        local_f8._28_4_ = local_f8._28_4_ + 1;
        *(undefined4 *)(local_f8 + uVar9 * 4) =
             *(undefined4 *)((long)&local_150._vptr_ParameterInit + lVar3);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
      local_140._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
      PVar6 = ParameterCollection::add_parameters
                        (this_00,(Dim *)local_f8,0.0,&local_140,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      local_f8._28_4_ = 1;
      local_f8._32_4_ = 1;
      local_150._vptr_ParameterInit = local_110;
      local_148 = 0;
      local_140._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
      PVar7 = ParameterCollection::add_parameters
                        (this_00,(Dim *)local_f8,&local_150,&local_140,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      local_f8._0_8_ = local_38;
      local_f8._8_8_ = local_40;
      local_f8._16_8_ = local_48;
      local_f8._24_4_ = SUB84(local_50,0);
      local_f8._28_4_ = (undefined4)((ulong)local_50 >> 0x20);
      local_f8._32_4_ = SUB84(local_58,0);
      local_f8._36_4_ = (undefined4)((ulong)local_58 >> 0x20);
      __l._M_len = 9;
      __l._M_array = (iterator)local_f8;
      local_f8._40_8_ = PVar4;
      local_f8._48_8_ = PVar5;
      local_f8._56_8_ = PVar6;
      local_f8._64_8_ = PVar7;
      std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
                ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)&local_140,__l,
                 (allocator_type *)&local_150);
      this_00 = local_118;
      std::
      vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
      ::push_back(local_100,(value_type *)&local_140);
      uVar2 = local_104;
      uVar9 = local_120;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      uVar10 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar10;
      input_dim = hidden_dim;
    } while (uVar10 != uVar2);
  }
  (this->super_RNNBuilder).dropout_rate = 0.0;
  return;
}

Assistant:

GRUBuilder::GRUBuilder(unsigned layers,
                       unsigned input_dim,
                       unsigned hidden_dim,
                       ParameterCollection& model) : hidden_dim(hidden_dim), layers(layers) {
  unsigned layer_input_dim = input_dim;
  local_model = model.add_subcollection("gru-builder");
  for (unsigned i = 0; i < layers; ++i) {
    // z
    Parameter p_x2z = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2z = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_bz = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // r
    Parameter p_x2r = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2r = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_br = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // h
    Parameter p_x2h = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2h = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_bh = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameter> ps = {p_x2z, p_h2z, p_bz, p_x2r, p_h2r, p_br, p_x2h, p_h2h, p_bh};
    params.push_back(ps);
  }  // layers
  dropout_rate = 0.f;
}